

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsmnutils.cpp
# Opt level: O0

void __thiscall JSONParser::load_file(JSONParser *this,string *filename)

{
  byte bVar1;
  undefined8 uVar2;
  size_type sVar3;
  size_type sVar4;
  reference pvVar5;
  long lVar6;
  vector<char,_std::allocator<char>_> *this_00;
  value_type local_241;
  size_type local_240;
  size_t len;
  undefined4 local_230;
  long local_220;
  ifstream is;
  string *filename_local;
  JSONParser *this_local;
  
  uVar2 = std::__cxx11::string::c_str();
  std::ifstream::ifstream(&local_220,uVar2,8);
  bVar1 = std::ios::operator!((ios *)((long)&local_220 + *(long *)(local_220 + -0x18)));
  if ((bVar1 & 1) == 0) {
    len._7_1_ = 0;
    std::vector<char,_std::allocator<char>_>::resize
              (&this->m_buffer,0x100,(value_type *)((long)&len + 7));
    local_240 = 0;
    while( true ) {
      bVar1 = std::ios::eof();
      if (((bVar1 ^ 0xff) & 1) == 0) break;
      if (local_240 != 0) {
        this_00 = &this->m_buffer;
        sVar3 = std::vector<char,_std::allocator<char>_>::size(this_00);
        sVar4 = std::vector<char,_std::allocator<char>_>::size(this_00);
        local_241 = '\0';
        std::vector<char,_std::allocator<char>_>::resize(this_00,sVar3 + (sVar4 >> 1),&local_241);
      }
      pvVar5 = std::vector<char,_std::allocator<char>_>::operator[](&this->m_buffer,local_240);
      std::vector<char,_std::allocator<char>_>::size(&this->m_buffer);
      std::istream::read((char *)&local_220,(long)pvVar5);
      lVar6 = std::istream::gcount();
      local_240 = lVar6 + local_240;
    }
    std::vector<char,_std::allocator<char>_>::resize(&this->m_buffer,local_240);
    this->m_buffer_loaded = true;
    local_230 = 0;
  }
  else {
    local_230 = 1;
  }
  std::ifstream::~ifstream(&local_220);
  return;
}

Assistant:

void JSONParser::load_file(std::string filename)
{
    std::ifstream is(filename.c_str());
    // If couldn't load
    if (!is) {
        return;
    }
    // Ignore previous data if any
    m_buffer.resize(256, 0);
    size_t len = 0;

    while (!is.eof()) {
        if (len > 0) {
            m_buffer.resize(m_buffer.size() +
                    m_buffer.size() / 2, 0);
        }
        len += is.read(&m_buffer[len],
                m_buffer.size() - len).gcount();
    }
    m_buffer.resize(len);
    m_buffer_loaded = true;
}